

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall amrex::MLABecLaplacian::setACoeffs(MLABecLaplacian *this,int amrlev,MultiFab *alpha)

{
  int iVar1;
  FabArrayBase *in_RDX;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *in_RDI;
  char *in_stack_000001d8;
  int in_stack_000001e4;
  char *in_stack_000001e8;
  char *in_stack_000001f0;
  size_type in_stack_ffffffffffffffb8;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *pVVar2;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  
  pVVar2 = in_RDI;
  iVar1 = FabArrayBase::nComp(in_RDX);
  if (iVar1 != 1) {
    in_stack_fffffffffffffff0 =
         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLABecLaplacian.cpp"
    ;
    in_stack_ffffffffffffffec = 0x7d;
    in_stack_ffffffffffffffe0 =
         "\"MLABecLaplacian::setACoeffs: alpha is supposed to be single component.\"";
    Assert_host(in_stack_000001f0,in_stack_000001e8,in_stack_000001e4,in_stack_000001d8);
  }
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                *)in_RDI,in_stack_ffffffffffffffb8);
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
            (in_RDI,in_stack_ffffffffffffffb8);
  MultiFab::Copy((MultiFab *)in_stack_fffffffffffffff0,
                 (MultiFab *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(int)in_stack_ffffffffffffffe0,
                 (int)((ulong)pVVar2 >> 0x20),(int)pVVar2);
  *(undefined1 *)
   &in_RDI[0x21].super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
    super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
    super__Vector_impl_data._M_finish = 1;
  return;
}

Assistant:

void
MLABecLaplacian::setACoeffs (int amrlev, const MultiFab& alpha)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(alpha.nComp() == 1,
                                     "MLABecLaplacian::setACoeffs: alpha is supposed to be single component.");
    MultiFab::Copy(m_a_coeffs[amrlev][0], alpha, 0, 0, 1, 0);
    m_needs_update = true;
}